

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzquadraticpyramid.cpp
# Opt level: O1

void pzgeom::TPZQuadraticPyramid::TShape<Fad<double>>
               (TPZVec<Fad<double>_> *par,TPZFMatrix<Fad<double>_> *phi,
               TPZFMatrix<Fad<double>_> *dphi)

{
  uint uVar1;
  Fad<double> *pFVar2;
  int iVar3;
  int i;
  long lVar4;
  ulong uVar5;
  long lVar6;
  Fad<double> eta;
  Fad<double> qsi;
  Fad<double> check;
  Fad<double> zeta;
  undefined1 local_260 [16];
  FadCst<int> FStack_250;
  Fad<double> *local_248;
  undefined1 local_240 [8];
  FadCst<int> local_238;
  FadCst<int> local_230;
  undefined1 local_228 [8];
  FadCst<int> local_220;
  FadCst<int> local_218;
  FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_> local_210;
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
  local_200;
  FadCst<int> local_1f0;
  undefined1 local_1e8 [8];
  undefined8 local_1e0;
  FadCst<int> local_1d8;
  undefined1 local_1d0 [8];
  Vector<double> local_1c8;
  FadCst<int> local_1b8;
  FadCst<int> local_1b0;
  FadCst<int> local_1a8;
  undefined1 local_1a0 [16];
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
  local_190;
  FadCst<int> FStack_180;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
  *local_178;
  FadCst<int> local_170;
  FadCst<int> local_168;
  Fad<double> local_160;
  Fad<double> local_140;
  FadCst<int> local_120;
  FadCst<int> local_118;
  undefined1 local_110 [16];
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
  local_100;
  FadCst<int> local_f0;
  Fad<double> *local_e8;
  FadCst<int> local_e0;
  FadCst<int> local_d8;
  FadCst<int> local_d0;
  FadCst<int> *local_c8;
  FadCst<int> *local_c0;
  FadCst<int> *local_b8;
  Fad<double> *local_b0;
  FadCst<int> **local_a8;
  Fad<double> *local_a0;
  Fad<double> *local_98;
  FadCst<int> local_90;
  FadCst<int> local_88;
  FadCst<int> *local_80;
  undefined8 local_78;
  Fad<double> local_70;
  Fad<double> local_50;
  
  pFVar2 = par->fStore;
  local_140.val_ = pFVar2->val_;
  uVar1 = (pFVar2->dx_).num_elts;
  local_140.dx_.ptr_to_data = (double *)0x0;
  local_140.dx_.num_elts = uVar1;
  if ((long)(int)uVar1 != 0) {
    uVar5 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar5 = (long)(int)uVar1 << 3;
    }
    local_140.dx_.ptr_to_data = (double *)operator_new__(uVar5);
    MEM_CPY<double>::copy
              ((MEM_CPY<double> *)local_140.dx_.ptr_to_data,
               (EVP_PKEY_CTX *)(pFVar2->dx_).ptr_to_data,(EVP_PKEY_CTX *)(ulong)uVar1);
  }
  local_140.defaultVal = pFVar2->defaultVal;
  pFVar2 = par->fStore;
  local_160.val_ = pFVar2[1].val_;
  uVar1 = pFVar2[1].dx_.num_elts;
  local_160.dx_.ptr_to_data = (double *)0x0;
  local_160.dx_.num_elts = uVar1;
  if ((long)(int)uVar1 != 0) {
    uVar5 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar5 = (long)(int)uVar1 * 8;
    }
    local_160.dx_.ptr_to_data = (double *)operator_new__(uVar5);
    MEM_CPY<double>::copy
              ((MEM_CPY<double> *)local_160.dx_.ptr_to_data,
               (EVP_PKEY_CTX *)pFVar2[1].dx_.ptr_to_data,(EVP_PKEY_CTX *)(ulong)uVar1);
  }
  local_160.defaultVal = pFVar2[1].defaultVal;
  pFVar2 = par->fStore;
  local_50.val_ = pFVar2[2].val_;
  uVar1 = pFVar2[2].dx_.num_elts;
  local_50.dx_.ptr_to_data = (double *)0x0;
  local_50.dx_.num_elts = uVar1;
  if ((long)(int)uVar1 != 0) {
    uVar5 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar5 = (long)(int)uVar1 * 8;
    }
    local_50.dx_.ptr_to_data = (double *)operator_new__(uVar5);
    MEM_CPY<double>::copy
              ((MEM_CPY<double> *)local_50.dx_.ptr_to_data,(EVP_PKEY_CTX *)pFVar2[2].dx_.ptr_to_data
               ,(EVP_PKEY_CTX *)(ulong)uVar1);
  }
  iVar3 = local_50.dx_.num_elts;
  local_50.defaultVal = pFVar2[2].defaultVal;
  local_70.val_ = local_50.val_ + -1.0;
  lVar6 = (long)local_50.dx_.num_elts;
  local_70.dx_.num_elts = 0;
  local_70.dx_.ptr_to_data = (double *)0x0;
  if (0 < lVar6) {
    local_70.dx_.num_elts = local_50.dx_.num_elts;
    local_70.dx_.ptr_to_data = (double *)operator_new__(lVar6 * 8);
    if (0 < iVar3) {
      lVar4 = 0;
      do {
        local_70.dx_.ptr_to_data[lVar4] = *(double *)((long)local_50.dx_.ptr_to_data + lVar4 * 8);
        lVar4 = lVar4 + 1;
      } while (lVar6 != lVar4);
    }
  }
  local_70.defaultVal = 0.0;
  if (1e-06 <= ABS(local_70.val_)) {
    local_210.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_190;
    local_190.fadexpr_.right_ =
         (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
          *)0x1;
    local_218 = (FadCst<int>)&local_160;
    local_230 = (FadCst<int>)&local_140;
    local_220.constant_ = -1;
    local_220.defaultVal = 0;
    local_1e0 = (FadCst<int>)local_1a0;
    local_1d0 = (undefined1  [8])local_1e8;
    local_170 = (FadCst<int>)local_240;
    local_238.constant_ = -1;
    local_238.defaultVal = 0;
    local_1c8._0_8_ = &local_170;
    local_1b8 = (FadCst<int>)local_1d0;
    local_200.fadexpr_.right_ = (Fad<double> *)0xffffffff;
    local_1b0 = (FadCst<int>)local_260;
    local_260._8_8_ = 4.0;
    FStack_250 = (FadCst<int>)0x0;
    local_248 = (Fad<double> *)&local_200;
    local_210.fadexpr_.right_ = (Fad<double> *)local_230;
    local_1f0 = (FadCst<int>)&local_50;
    local_1e8 = (undefined1  [8])&local_210;
    local_1a0._0_8_ =
         (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
          *)local_228;
    local_1a0._8_8_ = &local_50;
    FStack_180 = local_218;
    local_168 = (FadCst<int>)&local_50;
    if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
       ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (phi->fElem,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)&local_1b8);
    local_190.fadexpr_.right_ =
         (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
          *)0x1;
    local_230 = (FadCst<int>)&local_160;
    local_210.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_190;
    local_218 = (FadCst<int>)&local_140;
    local_220.constant_ = 1;
    local_220.defaultVal = 0;
    local_1e0 = (FadCst<int>)local_1a0;
    local_238.constant_ = -1;
    local_238.defaultVal = 0;
    local_170 = (FadCst<int>)local_240;
    local_1d0 = (undefined1  [8])local_1e8;
    local_1c8._0_8_ = &local_170;
    local_1b8 = (FadCst<int>)&local_120;
    local_120 = (FadCst<int>)local_1d0;
    local_200.fadexpr_.right_ = (Fad<double> *)0xffffffff;
    local_260._8_8_ = 4.0;
    FStack_250 = (FadCst<int>)0x0;
    local_1b0 = (FadCst<int>)local_260;
    local_210.fadexpr_.right_ = (Fad<double> *)local_218;
    FStack_180 = local_230;
    if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
       ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      local_248 = (Fad<double> *)&local_200;
      local_1f0 = (FadCst<int>)&local_50;
      local_1e8 = (undefined1  [8])&local_210;
      local_1a0._0_8_ =
           (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
            *)local_228;
      local_1a0._8_8_ = &local_50;
      local_168 = (FadCst<int>)&local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_248 = (Fad<double> *)&local_200;
    local_1f0 = (FadCst<int>)&local_50;
    local_1e8 = (undefined1  [8])&local_210;
    local_1a0._0_8_ =
         (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
          *)local_228;
    local_1a0._8_8_ = &local_50;
    local_168 = (FadCst<int>)&local_50;
    Fad<double>::operator=
              (phi->fElem + 1,
               (FadExpr<FadBinaryDiv<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)&local_1b8);
    local_220.constant_ = 1;
    local_220.defaultVal = 0;
    local_238.constant_ = 1;
    local_238.defaultVal = 0;
    local_190.fadexpr_.right_ =
         (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
          *)0xffffffff;
    local_218 = (FadCst<int>)&local_160;
    local_210.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_190;
    local_230 = (FadCst<int>)&local_140;
    local_1e0 = (FadCst<int>)local_1a0;
    local_170 = (FadCst<int>)local_240;
    local_1d0 = (undefined1  [8])local_1e8;
    local_1c8._0_8_ = &local_170;
    local_120 = (FadCst<int>)local_1d0;
    local_200.fadexpr_.right_ = (Fad<double> *)0xffffffff;
    local_260._8_8_ = 4.0;
    FStack_250 = (FadCst<int>)0x0;
    local_1b8 = (FadCst<int>)&local_120;
    local_1b0 = (FadCst<int>)local_260;
    local_210.fadexpr_.right_ = (Fad<double> *)local_230;
    FStack_180 = local_218;
    if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 3) ||
       ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      local_248 = (Fad<double> *)&local_200;
      local_1f0 = (FadCst<int>)&local_50;
      local_1e8 = (undefined1  [8])&local_210;
      local_1a0._0_8_ =
           (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
            *)local_228;
      local_1a0._8_8_ = &local_50;
      local_168 = (FadCst<int>)&local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_248 = (Fad<double> *)&local_200;
    local_1f0 = (FadCst<int>)&local_50;
    local_1e8 = (undefined1  [8])&local_210;
    local_1a0._0_8_ =
         (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
          *)local_228;
    local_1a0._8_8_ = &local_50;
    local_168 = (FadCst<int>)&local_50;
    Fad<double>::operator=
              (phi->fElem + 2,
               (FadExpr<FadBinaryDiv<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)&local_1b8);
    local_190.fadexpr_.right_ =
         (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
          *)0xffffffff;
    local_218 = (FadCst<int>)&local_160;
    local_210.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_190;
    local_230 = (FadCst<int>)&local_140;
    local_220.constant_ = 1;
    local_220.defaultVal = 0;
    local_1e0 = (FadCst<int>)local_1a0;
    local_238.constant_ = -1;
    local_238.defaultVal = 0;
    local_170 = (FadCst<int>)local_240;
    local_1d0 = (undefined1  [8])local_1e8;
    local_1c8._0_8_ = &local_170;
    local_200.fadexpr_.right_ = (Fad<double> *)0xffffffff;
    local_260._8_8_ = 4.0;
    FStack_250 = (FadCst<int>)0x0;
    local_1b8 = (FadCst<int>)local_1d0;
    local_1b0 = (FadCst<int>)local_260;
    local_210.fadexpr_.right_ = (Fad<double> *)local_230;
    FStack_180 = local_218;
    if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 4) ||
       ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      local_248 = (Fad<double> *)&local_200;
      local_1f0 = (FadCst<int>)&local_50;
      local_1e8 = (undefined1  [8])&local_210;
      local_1a0._0_8_ =
           (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
            *)local_228;
      local_1a0._8_8_ = &local_50;
      local_168 = (FadCst<int>)&local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_248 = (Fad<double> *)&local_200;
    local_1f0 = (FadCst<int>)&local_50;
    local_1e8 = (undefined1  [8])&local_210;
    local_1a0._0_8_ =
         (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
          *)local_228;
    local_1a0._8_8_ = &local_50;
    local_168 = (FadCst<int>)&local_50;
    Fad<double>::operator=
              (phi->fElem + 3,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)&local_1b8);
    local_190.fadexpr_.right_ =
         (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
          *)0x2;
    local_260._8_8_ = 2.12199579047121e-314;
    FStack_250 = (FadCst<int>)&local_190;
    local_220 = (FadCst<int>)local_260;
    local_228 = (undefined1  [8])&local_50;
    FStack_180 = (FadCst<int>)&local_50;
    if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 5) ||
       ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    Fad<double>::operator=
              (phi->fElem + 4,
               (FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)local_228);
    local_190.fadexpr_.right_ =
         (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
          *)0xffffffff;
    FStack_180 = (FadCst<int>)&local_160;
    local_210.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_190;
    local_220.constant_ = -1;
    local_220.defaultVal = 0;
    local_230 = (FadCst<int>)&local_140;
    local_1e0 = (FadCst<int>)local_1a0;
    local_238.constant_ = -1;
    local_238.defaultVal = 0;
    local_170 = (FadCst<int>)local_240;
    local_1d0 = (undefined1  [8])local_1e8;
    local_1c8._0_8_ = &local_170;
    local_200.fadexpr_.right_ = (Fad<double> *)0xffffffff;
    local_260._8_8_ = 2.0;
    FStack_250 = (FadCst<int>)0x0;
    local_1b8 = (FadCst<int>)local_1d0;
    local_1b0 = (FadCst<int>)local_260;
    local_218 = local_230;
    local_210.fadexpr_.right_ = &local_50;
    local_1a0._0_8_ = local_228;
    if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 6) ||
       ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      local_248 = (Fad<double> *)&local_200;
      local_1f0 = (FadCst<int>)&local_50;
      local_1e8 = (undefined1  [8])&local_210;
      local_1a0._8_8_ = &local_50;
      local_168 = (FadCst<int>)&local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_248 = (Fad<double> *)&local_200;
    local_1f0 = (FadCst<int>)&local_50;
    local_1e8 = (undefined1  [8])&local_210;
    local_1a0._8_8_ = &local_50;
    local_168 = (FadCst<int>)&local_50;
    Fad<double>::operator=
              (phi->fElem + 5,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)&local_1b8);
    local_190.fadexpr_.right_ =
         (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
          *)0xffffffff;
    local_218 = (FadCst<int>)&local_160;
    local_210.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_190;
    local_220.constant_ = -1;
    local_220.defaultVal = 0;
    local_1e0 = (FadCst<int>)local_1a0;
    local_238.constant_ = -1;
    local_238.defaultVal = 0;
    local_230 = (FadCst<int>)&local_140;
    local_170 = (FadCst<int>)local_240;
    local_1d0 = (undefined1  [8])local_1e8;
    local_1c8._0_8_ = &local_170;
    local_200.fadexpr_.right_ = (Fad<double> *)0xffffffff;
    local_260._8_8_ = 2.0;
    FStack_250 = (FadCst<int>)0x0;
    local_1b8 = (FadCst<int>)local_1d0;
    local_1b0 = (FadCst<int>)local_260;
    FStack_180 = local_218;
    if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 7) ||
       ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      local_248 = (Fad<double> *)&local_200;
      local_210.fadexpr_.right_ = &local_50;
      local_1f0 = (FadCst<int>)&local_50;
      local_1e8 = (undefined1  [8])&local_210;
      local_1a0._0_8_ = local_228;
      local_1a0._8_8_ = &local_50;
      local_168 = (FadCst<int>)&local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_248 = (Fad<double> *)&local_200;
    local_210.fadexpr_.right_ = &local_50;
    local_1f0 = (FadCst<int>)&local_50;
    local_1e8 = (undefined1  [8])&local_210;
    local_1a0._0_8_ = local_228;
    local_1a0._8_8_ = &local_50;
    local_168 = (FadCst<int>)&local_50;
    Fad<double>::operator=
              (phi->fElem + 6,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)&local_1b8);
    local_210.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_140;
    local_190.fadexpr_.right_ =
         (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
          *)0xffffffff;
    local_220.constant_ = -1;
    local_220.defaultVal = 0;
    local_1a0._0_8_ = &local_190;
    local_1e0 = (FadCst<int>)local_1a0;
    local_238.constant_ = 1;
    local_238.defaultVal = 0;
    local_230 = (FadCst<int>)&local_160;
    local_170 = (FadCst<int>)local_240;
    local_1d0 = (undefined1  [8])local_1e8;
    local_1c8._0_8_ = &local_170;
    local_200.fadexpr_.right_ = (Fad<double> *)0xffffffff;
    local_260._8_8_ = 2.0;
    FStack_250 = (FadCst<int>)0x0;
    local_1b8 = (FadCst<int>)local_1d0;
    local_1b0 = (FadCst<int>)local_260;
    local_218 = (FadCst<int>)&local_50;
    local_210.fadexpr_.right_ = (Fad<double> *)local_210.fadexpr_.left_;
    local_1a0._8_8_ = local_228;
    if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 8) ||
       ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      local_248 = (Fad<double> *)&local_200;
      local_1f0 = (FadCst<int>)&local_50;
      local_1e8 = (undefined1  [8])&local_210;
      FStack_180 = (FadCst<int>)&local_50;
      local_168 = (FadCst<int>)&local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_248 = (Fad<double> *)&local_200;
    local_1f0 = (FadCst<int>)&local_50;
    local_1e8 = (undefined1  [8])&local_210;
    FStack_180 = (FadCst<int>)&local_50;
    local_168 = (FadCst<int>)&local_50;
    Fad<double>::operator=
              (phi->fElem + 7,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)&local_1b8);
    local_210.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_160;
    local_190.fadexpr_.right_ =
         (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
          *)0xffffffff;
    local_220.constant_ = -1;
    local_220.defaultVal = 0;
    local_1e8 = (undefined1  [8])&local_120;
    local_1e0 = (FadCst<int>)local_1a0;
    local_238.constant_ = -1;
    local_238.defaultVal = 0;
    local_230 = (FadCst<int>)&local_140;
    local_170 = (FadCst<int>)local_240;
    local_1d0 = (undefined1  [8])local_1e8;
    local_1c8._0_8_ = &local_170;
    local_200.fadexpr_.right_ = (Fad<double> *)0xffffffff;
    local_260._8_8_ = 2.0;
    FStack_250 = (FadCst<int>)0x0;
    local_248 = (Fad<double> *)&local_200;
    local_1b8 = (FadCst<int>)local_1d0;
    local_1b0 = (FadCst<int>)local_260;
    local_210.fadexpr_.right_ = (Fad<double> *)local_210.fadexpr_.left_;
    local_1a0._0_8_ = &local_190;
    local_120 = (FadCst<int>)&local_210;
    if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 9) ||
       ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      local_218 = (FadCst<int>)&local_50;
      local_1f0 = (FadCst<int>)&local_50;
      local_1a0._8_8_ = local_228;
      FStack_180 = (FadCst<int>)&local_50;
      local_168 = (FadCst<int>)&local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_218 = (FadCst<int>)&local_50;
    local_1f0 = (FadCst<int>)&local_50;
    local_1a0._8_8_ = local_228;
    FStack_180 = (FadCst<int>)&local_50;
    local_168 = (FadCst<int>)&local_50;
    Fad<double>::operator=
              (phi->fElem + 8,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)&local_1b8);
    local_260._8_8_ = 2.12199579047121e-314;
    FStack_250 = (FadCst<int>)&local_160;
    local_1d0 = (undefined1  [8])local_260;
    local_1b0 = (FadCst<int>)local_1d0;
    local_190.fadexpr_.right_ =
         (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
          *)0xffffffff;
    FStack_180 = (FadCst<int>)&local_140;
    local_200.fadexpr_.right_ = (Fad<double> *)local_1e8;
    local_220.constant_ = -1;
    local_220.defaultVal = 0;
    local_240 = (undefined1  [8])&local_200;
    local_210.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_240;
    local_238 = (FadCst<int>)local_228;
    local_200.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_1b8;
    local_1e8 = (undefined1  [8])&local_190;
    local_1e0 = (FadCst<int>)&local_50;
    local_1c8._0_8_ = &local_50;
    local_1b8 = (FadCst<int>)&local_50;
    if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 10) ||
       ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      local_218 = (FadCst<int>)&local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_218 = (FadCst<int>)&local_50;
    Fad<double>::operator=
              (phi->fElem + 9,
               (FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)&local_210);
    local_260._8_8_ = 2.12199579047121e-314;
    FStack_250 = (FadCst<int>)&local_160;
    local_1d0 = (undefined1  [8])local_260;
    local_1b0 = (FadCst<int>)local_1d0;
    local_190.fadexpr_.right_ =
         (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
          *)0xffffffff;
    FStack_180 = (FadCst<int>)&local_140;
    local_200.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_1b8;
    local_200.fadexpr_.right_ = (Fad<double> *)local_1e8;
    local_220.constant_ = -1;
    local_220.defaultVal = 0;
    local_240 = (undefined1  [8])&local_200;
    local_210.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_240;
    if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 0xb) ||
       ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      local_238 = (FadCst<int>)local_228;
      local_218 = (FadCst<int>)&local_50;
      local_1e8 = (undefined1  [8])&local_190;
      local_1e0 = (FadCst<int>)&local_50;
      local_1c8._0_8_ = &local_50;
      local_1b8 = (FadCst<int>)&local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_238 = (FadCst<int>)local_228;
    local_218 = (FadCst<int>)&local_50;
    local_1e8 = (undefined1  [8])&local_190;
    local_1e0 = (FadCst<int>)&local_50;
    local_1c8._0_8_ = &local_50;
    local_1b8 = (FadCst<int>)&local_50;
    Fad<double>::operator=
              (phi->fElem + 10,
               (FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)&local_210);
    local_260._8_8_ = 4.94065645841247e-324;
    FStack_250 = (FadCst<int>)&local_160;
    local_1d0 = (undefined1  [8])local_260;
    local_190.fadexpr_.right_ =
         (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
          *)0x1;
    FStack_180 = (FadCst<int>)&local_140;
    local_1b8 = (FadCst<int>)local_1d0;
    local_1b0 = (FadCst<int>)local_1e8;
    local_220.constant_ = 1;
    local_220.defaultVal = 0;
    local_240 = (undefined1  [8])&local_200;
    local_200.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_1b8;
    local_200.fadexpr_.right_ = &local_50;
    if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 0xc) ||
       ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      local_238 = (FadCst<int>)local_228;
      local_218 = (FadCst<int>)&local_50;
      local_1e8 = (undefined1  [8])&local_190;
      local_1e0 = (FadCst<int>)&local_50;
      local_1c8._0_8_ = &local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_238 = (FadCst<int>)local_228;
    local_218 = (FadCst<int>)&local_50;
    local_1e8 = (undefined1  [8])&local_190;
    local_1e0 = (FadCst<int>)&local_50;
    local_1c8._0_8_ = &local_50;
    Fad<double>::operator=
              (phi->fElem + 0xb,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>_>_>
                *)local_240);
    local_260._8_8_ = 2.12199579047121e-314;
    FStack_250 = (FadCst<int>)&local_160;
    local_1d0 = (undefined1  [8])local_260;
    local_1b0 = (FadCst<int>)local_1d0;
    local_190.fadexpr_.right_ =
         (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
          *)0xffffffff;
    FStack_180 = (FadCst<int>)&local_140;
    local_200.fadexpr_.right_ = (Fad<double> *)local_1e8;
    local_220.constant_ = -1;
    local_220.defaultVal = 0;
    local_240 = (undefined1  [8])&local_200;
    local_238 = (FadCst<int>)local_228;
    local_210.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_240;
    if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 0xd) ||
       ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      local_218 = (FadCst<int>)&local_50;
      local_200.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_1b8;
      local_1e8 = (undefined1  [8])&local_190;
      local_1e0 = (FadCst<int>)&local_50;
      local_1c8._0_8_ = &local_50;
      local_1b8 = (FadCst<int>)&local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_218 = (FadCst<int>)&local_50;
    local_200.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_1b8;
    local_1e8 = (undefined1  [8])&local_190;
    local_1e0 = (FadCst<int>)&local_50;
    local_1c8._0_8_ = &local_50;
    local_1b8 = (FadCst<int>)&local_50;
    Fad<double>::operator=
              (phi->fElem + 0xc,
               (FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)&local_210);
    local_190.fadexpr_.right_ =
         (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
          *)0xffffffff;
    local_210.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_160;
    local_220.constant_ = 2;
    local_220.defaultVal = 0;
    local_218 = (FadCst<int>)&local_140;
    local_1b8 = (FadCst<int>)local_1d0;
    local_1b0 = (FadCst<int>)local_1e8;
    local_238.constant_ = -1;
    local_238.defaultVal = 0;
    local_260._8_8_ = 4.0;
    FStack_250 = (FadCst<int>)0x0;
    local_248 = (Fad<double> *)local_240;
    local_200.fadexpr_.right_ = (Fad<double> *)local_260;
    local_230 = (FadCst<int>)&local_50;
    local_210.fadexpr_.right_ = (Fad<double> *)local_228;
    local_1e8 = (undefined1  [8])&local_210;
    local_1d0 = (undefined1  [8])&local_190;
    FStack_180 = (FadCst<int>)local_210.fadexpr_.left_;
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      local_200.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_1b8;
      local_1e0 = (FadCst<int>)&local_50;
      local_1c8._0_8_ = &local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_200.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_1b8;
    local_1e0 = (FadCst<int>)&local_50;
    local_1c8._0_8_ = &local_50;
    Fad<double>::operator=
              (dphi->fElem,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)&local_200);
    local_190.fadexpr_.right_ =
         (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
          *)0xffffffff;
    local_210.fadexpr_.right_ = &local_140;
    local_220.constant_ = 2;
    local_220.defaultVal = 0;
    local_218 = (FadCst<int>)&local_160;
    local_1b8 = (FadCst<int>)local_1d0;
    local_1b0 = (FadCst<int>)local_1e8;
    local_238.constant_ = -1;
    local_238.defaultVal = 0;
    local_260._8_8_ = 4.0;
    FStack_250 = (FadCst<int>)0x0;
    local_248 = (Fad<double> *)local_240;
    local_200.fadexpr_.right_ = (Fad<double> *)local_260;
    local_210.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_228;
    FStack_180 = (FadCst<int>)local_210.fadexpr_.right_;
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      local_230 = (FadCst<int>)&local_50;
      local_200.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_1b8;
      local_1e8 = (undefined1  [8])&local_210;
      local_1e0 = (FadCst<int>)&local_50;
      local_1d0 = (undefined1  [8])&local_190;
      local_1c8._0_8_ = &local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_230 = (FadCst<int>)&local_50;
    local_200.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_1b8;
    local_1e8 = (undefined1  [8])&local_210;
    local_1e0 = (FadCst<int>)&local_50;
    local_1d0 = (undefined1  [8])&local_190;
    local_1c8._0_8_ = &local_50;
    Fad<double>::operator=
              (dphi->fElem + 1,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)&local_200);
    local_120 = (FadCst<int>)&local_a0;
    local_b0 = &local_160;
    local_230 = (FadCst<int>)&local_140;
    local_c8 = &local_e0;
    local_c0 = &local_d0;
    local_190.fadexpr_.right_ =
         (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
          *)0xffffffff;
    local_220.constant_ = -1;
    local_220.defaultVal = 0;
    local_b8 = &local_f0;
    local_a8 = &local_c0;
    local_168 = (FadCst<int>)&local_b0;
    local_170 = (FadCst<int>)&local_120;
    local_238.constant_ = 1;
    local_238.defaultVal = 0;
    local_200.fadexpr_.right_ = (Fad<double> *)0xffffffff;
    local_1b0.constant_ = -1;
    local_1b0.defaultVal = 0;
    local_100.fadexpr_.right_ = (Fad<double> *)local_110;
    local_1a0._8_8_ = &local_100;
    local_100.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_240;
    local_1a0._0_8_ = &local_170;
    local_210.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_90;
    local_90 = (FadCst<int>)local_1a0;
    local_1c8.num_elts = -1;
    local_1c8._4_4_ = 0;
    local_1e0 = (FadCst<int>)0xffffffff;
    local_88 = (FadCst<int>)local_1d0;
    local_80 = (FadCst<int> *)local_1e8;
    local_260._8_8_ = 4.0;
    FStack_250 = (FadCst<int>)0x0;
    local_210.fadexpr_.right_ = (Fad<double> *)local_260;
    local_248 = (Fad<double> *)&local_88;
    local_1d8 = (FadCst<int>)&local_50;
    local_1c8.ptr_to_data = &local_50.val_;
    local_1a8 = (FadCst<int>)&local_50;
    local_118 = local_230;
    local_110._0_8_ =
         (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
          *)&local_200;
    local_110._8_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_1b8;
    local_f0 = (FadCst<int>)&local_190;
    local_e8 = (Fad<double> *)local_228;
    local_e0 = local_230;
    local_d8 = local_230;
    local_d0 = local_230;
    local_a0 = local_b0;
    local_98 = local_b0;
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 3) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      local_218 = (FadCst<int>)&local_50;
      local_1f0 = (FadCst<int>)&local_50;
      FStack_180 = (FadCst<int>)&local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_218 = (FadCst<int>)&local_50;
    local_1f0 = (FadCst<int>)&local_50;
    FStack_180 = (FadCst<int>)&local_50;
    Fad<double>::operator=
              (dphi->fElem + 2,
               (FadExpr<FadBinaryDiv<FadExpr<FadUnaryMin<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
                *)&local_210);
    local_190.fadexpr_.right_ =
         (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
          *)0xffffffff;
    local_210.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_160;
    local_220.constant_ = 2;
    local_220.defaultVal = 0;
    local_218 = (FadCst<int>)&local_140;
    local_210.fadexpr_.right_ = (Fad<double> *)local_228;
    local_1b8 = (FadCst<int>)local_1d0;
    local_1b0 = (FadCst<int>)local_1e8;
    local_238.constant_ = -1;
    local_238.defaultVal = 0;
    local_260._8_8_ = 4.0;
    FStack_250 = (FadCst<int>)0x0;
    local_248 = (Fad<double> *)local_240;
    local_200.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_1a0;
    local_200.fadexpr_.right_ = (Fad<double> *)local_260;
    local_1e8 = (undefined1  [8])&local_210;
    local_1a0._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_1b8;
    FStack_180 = (FadCst<int>)local_210.fadexpr_.left_;
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 2)) {
      local_230 = (FadCst<int>)&local_50;
      local_1e0 = (FadCst<int>)&local_50;
      local_1d0 = (undefined1  [8])&local_190;
      local_1c8._0_8_ = &local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_230 = (FadCst<int>)&local_50;
    local_1e0 = (FadCst<int>)&local_50;
    local_1d0 = (undefined1  [8])&local_190;
    local_1c8._0_8_ = &local_50;
    Fad<double>::operator=
              (dphi->fElem + (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow,
               (FadExpr<FadBinaryDiv<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)&local_200);
    local_190.fadexpr_.right_ =
         (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
          *)0x1;
    local_210.fadexpr_.right_ = &local_140;
    local_78 = 0xfffffffe;
    local_220.constant_ = -2;
    local_220.defaultVal = 0;
    local_218 = (FadCst<int>)&local_160;
    local_210.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_228;
    local_1b8 = (FadCst<int>)local_1d0;
    local_1b0 = (FadCst<int>)local_1e8;
    local_238.constant_ = -1;
    local_238.defaultVal = 0;
    local_260._8_8_ = 4.0;
    FStack_250 = (FadCst<int>)0x0;
    local_248 = (Fad<double> *)local_240;
    local_200.fadexpr_.right_ = (Fad<double> *)local_260;
    FStack_180 = (FadCst<int>)local_210.fadexpr_.right_;
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 2)) {
      local_230 = (FadCst<int>)&local_50;
      local_200.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_1b8;
      local_1e8 = (undefined1  [8])&local_210;
      local_1e0 = (FadCst<int>)&local_50;
      local_1d0 = (undefined1  [8])&local_190;
      local_1c8._0_8_ = &local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_230 = (FadCst<int>)&local_50;
    local_200.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_1b8;
    local_1e8 = (undefined1  [8])&local_210;
    local_1e0 = (FadCst<int>)&local_50;
    local_1d0 = (undefined1  [8])&local_190;
    local_1c8._0_8_ = &local_50;
    Fad<double>::operator=
              (dphi->fElem + (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow + 1,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)&local_200);
    local_b0 = &local_160;
    local_120 = (FadCst<int>)&local_a0;
    local_230 = (FadCst<int>)&local_140;
    local_c8 = &local_e0;
    local_190.fadexpr_.right_ =
         (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
          *)0xffffffff;
    local_220.constant_ = -1;
    local_220.defaultVal = 0;
    local_e8 = (Fad<double> *)local_228;
    local_c0 = &local_d0;
    local_b8 = &local_f0;
    local_a8 = &local_c0;
    local_170 = (FadCst<int>)&local_120;
    local_168 = (FadCst<int>)&local_b0;
    local_238.constant_ = -1;
    local_238.defaultVal = 0;
    local_200.fadexpr_.right_ = (Fad<double> *)0xffffffff;
    local_1b0.constant_ = -1;
    local_1b0.defaultVal = 0;
    local_100.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_240;
    local_100.fadexpr_.right_ = (Fad<double> *)local_110;
    local_1a0._0_8_ = &local_170;
    local_1a0._8_8_ = &local_100;
    local_1c8.num_elts = -1;
    local_1c8._4_4_ = 0;
    local_1e0 = (FadCst<int>)0xffffffff;
    local_88 = (FadCst<int>)local_1d0;
    local_80 = (FadCst<int> *)local_1e8;
    local_260._8_8_ = 4.0;
    FStack_250 = (FadCst<int>)0x0;
    local_210.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_1a0;
    local_210.fadexpr_.right_ = (Fad<double> *)local_260;
    local_118 = local_230;
    local_110._0_8_ =
         (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
          *)&local_200;
    local_e0 = local_230;
    local_d8 = local_230;
    local_d0 = local_230;
    local_a0 = local_b0;
    local_98 = local_b0;
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 3) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 2)) {
      local_248 = (Fad<double> *)&local_88;
      local_218 = (FadCst<int>)&local_50;
      local_1f0 = (FadCst<int>)&local_50;
      local_1d8 = (FadCst<int>)&local_50;
      local_1c8.ptr_to_data = &local_50.val_;
      local_1a8 = (FadCst<int>)&local_50;
      FStack_180 = (FadCst<int>)&local_50;
      local_110._8_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_1b8;
      local_f0 = (FadCst<int>)&local_190;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_248 = (Fad<double> *)&local_88;
    local_218 = (FadCst<int>)&local_50;
    local_1f0 = (FadCst<int>)&local_50;
    local_1d8 = (FadCst<int>)&local_50;
    local_1c8.ptr_to_data = &local_50.val_;
    local_1a8 = (FadCst<int>)&local_50;
    FStack_180 = (FadCst<int>)&local_50;
    local_110._8_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_1b8;
    local_f0 = (FadCst<int>)&local_190;
    Fad<double>::operator=
              (dphi->fElem + (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow + 2,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
                *)&local_210);
    local_190.fadexpr_.right_ =
         (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
          *)0x1;
    local_210.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_160;
    local_220.constant_ = 2;
    local_220.defaultVal = 0;
    local_218 = (FadCst<int>)&local_140;
    local_210.fadexpr_.right_ = (Fad<double> *)local_228;
    local_1b8 = (FadCst<int>)local_1d0;
    local_1b0 = (FadCst<int>)local_1e8;
    local_1a0._0_8_ = &local_1b8;
    local_238.constant_ = -1;
    local_238.defaultVal = 0;
    local_260._8_8_ = 4.0;
    FStack_250 = (FadCst<int>)0x0;
    local_248 = (Fad<double> *)local_240;
    local_200.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_1a0;
    local_200.fadexpr_.right_ = (Fad<double> *)local_260;
    local_1e8 = (undefined1  [8])&local_210;
    FStack_180 = (FadCst<int>)local_210.fadexpr_.left_;
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 3)) {
      local_230 = (FadCst<int>)&local_50;
      local_1e0 = (FadCst<int>)&local_50;
      local_1d0 = (undefined1  [8])&local_190;
      local_1c8._0_8_ = &local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_230 = (FadCst<int>)&local_50;
    local_1e0 = (FadCst<int>)&local_50;
    local_1d0 = (undefined1  [8])&local_190;
    local_1c8._0_8_ = &local_50;
    Fad<double>::operator=
              (dphi->fElem + (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 2,
               (FadExpr<FadBinaryDiv<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)&local_200);
    local_190.fadexpr_.right_ =
         (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
          *)0x1;
    local_210.fadexpr_.right_ = &local_140;
    local_220.constant_ = 2;
    local_220.defaultVal = 0;
    local_218 = (FadCst<int>)&local_160;
    local_210.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_228;
    local_1b8 = (FadCst<int>)local_1d0;
    local_1b0 = (FadCst<int>)local_1e8;
    local_1a0._0_8_ = &local_1b8;
    local_238.constant_ = -1;
    local_238.defaultVal = 0;
    local_260._8_8_ = 4.0;
    FStack_250 = (FadCst<int>)0x0;
    local_248 = (Fad<double> *)local_240;
    local_200.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_1a0;
    local_200.fadexpr_.right_ = (Fad<double> *)local_260;
    FStack_180 = (FadCst<int>)local_210.fadexpr_.right_;
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 3)) {
      local_230 = (FadCst<int>)&local_50;
      local_1e8 = (undefined1  [8])&local_210;
      local_1e0 = (FadCst<int>)&local_50;
      local_1d0 = (undefined1  [8])&local_190;
      local_1c8._0_8_ = &local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_230 = (FadCst<int>)&local_50;
    local_1e8 = (undefined1  [8])&local_210;
    local_1e0 = (FadCst<int>)&local_50;
    local_1d0 = (undefined1  [8])&local_190;
    local_1c8._0_8_ = &local_50;
    Fad<double>::operator=
              (dphi->fElem + (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 2 + 1,
               (FadExpr<FadBinaryDiv<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)&local_200);
    local_b0 = &local_160;
    local_120 = (FadCst<int>)&local_a0;
    local_230 = (FadCst<int>)&local_140;
    local_d0 = (FadCst<int>)&local_90;
    local_c8 = &local_e0;
    local_190.fadexpr_.right_ =
         (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
          *)0xffffffff;
    local_220.constant_ = -1;
    local_220.defaultVal = 0;
    local_e8 = (Fad<double> *)local_228;
    local_c0 = &local_d0;
    local_b8 = &local_f0;
    local_a8 = &local_c0;
    local_170 = (FadCst<int>)&local_120;
    local_168 = (FadCst<int>)&local_b0;
    local_238.constant_ = -1;
    local_238.defaultVal = 0;
    local_200.fadexpr_.right_ = (Fad<double> *)0xffffffff;
    local_1b0.constant_ = -1;
    local_1b0.defaultVal = 0;
    local_110._8_8_ = &local_1b8;
    local_100.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_240;
    local_100.fadexpr_.right_ = (Fad<double> *)local_110;
    local_1a0._0_8_ = &local_170;
    local_1a0._8_8_ = &local_100;
    local_1c8.num_elts = -1;
    local_1c8._4_4_ = 0;
    local_1e0 = (FadCst<int>)0xffffffff;
    local_88 = (FadCst<int>)local_1d0;
    local_80 = (FadCst<int> *)local_1e8;
    local_260._8_8_ = 4.0;
    FStack_250 = (FadCst<int>)0x0;
    local_210.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_1a0;
    local_210.fadexpr_.right_ = (Fad<double> *)local_260;
    local_118 = local_230;
    local_110._0_8_ =
         (FadExpr<FadBinaryDiv<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
          *)&local_200;
    local_e0 = local_230;
    local_d8 = local_230;
    local_a0 = local_b0;
    local_98 = local_b0;
    local_90 = local_230;
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 3) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 3)) {
      local_248 = (Fad<double> *)&local_88;
      local_218 = (FadCst<int>)&local_50;
      local_1f0 = (FadCst<int>)&local_50;
      local_1d8 = (FadCst<int>)&local_50;
      local_1c8.ptr_to_data = &local_50.val_;
      local_1a8 = (FadCst<int>)&local_50;
      FStack_180 = (FadCst<int>)&local_50;
      local_f0 = (FadCst<int>)&local_190;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_248 = (Fad<double> *)&local_88;
    local_218 = (FadCst<int>)&local_50;
    local_1f0 = (FadCst<int>)&local_50;
    local_1d8 = (FadCst<int>)&local_50;
    local_1c8.ptr_to_data = &local_50.val_;
    local_1a8 = (FadCst<int>)&local_50;
    FStack_180 = (FadCst<int>)&local_50;
    local_f0 = (FadCst<int>)&local_190;
    Fad<double>::operator=
              (dphi->fElem + (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 2 + 2,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
                *)&local_210);
    local_190.fadexpr_.right_ =
         (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
          *)0x1;
    local_210.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_160;
    local_220.constant_ = 2;
    local_220.defaultVal = 0;
    local_218 = (FadCst<int>)&local_140;
    local_210.fadexpr_.right_ = (Fad<double> *)local_228;
    local_1b8 = (FadCst<int>)local_1d0;
    local_1b0 = (FadCst<int>)local_1e8;
    local_238.constant_ = -1;
    local_238.defaultVal = 0;
    local_260._8_8_ = 4.0;
    FStack_250 = (FadCst<int>)0x0;
    local_248 = (Fad<double> *)local_240;
    local_200.fadexpr_.right_ = (Fad<double> *)local_260;
    local_200.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_1b8;
    local_1e8 = (undefined1  [8])&local_210;
    FStack_180 = (FadCst<int>)local_210.fadexpr_.left_;
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 4)) {
      local_230 = (FadCst<int>)&local_50;
      local_1e0 = (FadCst<int>)&local_50;
      local_1d0 = (undefined1  [8])&local_190;
      local_1c8._0_8_ = &local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_230 = (FadCst<int>)&local_50;
    local_1e0 = (FadCst<int>)&local_50;
    local_1d0 = (undefined1  [8])&local_190;
    local_1c8._0_8_ = &local_50;
    Fad<double>::operator=
              (dphi->fElem + (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 3,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<Fad<double>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)&local_200);
    local_190.fadexpr_.right_ =
         (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
          *)0x2;
    FStack_180 = (FadCst<int>)&local_160;
    local_218 = (FadCst<int>)&local_140;
    local_1d0 = (undefined1  [8])local_1e8;
    local_220.constant_ = -1;
    local_220.defaultVal = 0;
    local_210.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_228;
    local_1b8 = (FadCst<int>)local_1d0;
    local_238.constant_ = -1;
    local_238.defaultVal = 0;
    local_260._8_8_ = 4.0;
    FStack_250 = (FadCst<int>)0x0;
    local_248 = (Fad<double> *)local_240;
    local_200.fadexpr_.right_ = (Fad<double> *)local_260;
    local_1e0 = local_218;
    local_1b0 = (FadCst<int>)&local_210;
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 4)) {
      local_230 = (FadCst<int>)&local_50;
      local_210.fadexpr_.right_ = &local_50;
      local_200.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_1b8;
      local_1e8 = (undefined1  [8])&local_190;
      local_1c8._0_8_ = &local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_230 = (FadCst<int>)&local_50;
    local_210.fadexpr_.right_ = &local_50;
    local_200.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_1b8;
    local_1e8 = (undefined1  [8])&local_190;
    local_1c8._0_8_ = &local_50;
    Fad<double>::operator=
              (dphi->fElem + (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 3 + 1,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)&local_200);
    local_120 = (FadCst<int>)&local_a0;
    local_90 = (FadCst<int>)&local_120;
    local_230 = (FadCst<int>)&local_140;
    local_c8 = &local_e0;
    local_c0 = &local_d0;
    local_b8 = &local_f0;
    local_b0 = &local_160;
    local_a8 = &local_c0;
    local_170 = (FadCst<int>)&local_90;
    local_168 = (FadCst<int>)&local_b0;
    local_100.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_240;
    local_100.fadexpr_.right_ = (Fad<double> *)local_110;
    local_1a0._0_8_ = &local_170;
    local_1a0._8_8_ = &local_100;
    local_260._8_8_ = 4.0;
    FStack_250 = (FadCst<int>)0x0;
    local_210.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_1a0;
    local_210.fadexpr_.right_ = (Fad<double> *)local_260;
    local_190.fadexpr_.right_ =
         (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
          *)0xffffffff;
    local_220.constant_ = -1;
    local_220.defaultVal = 0;
    local_e8 = (Fad<double> *)local_228;
    local_238.constant_ = 1;
    local_238.defaultVal = 0;
    local_200.fadexpr_.right_ = (Fad<double> *)0xffffffff;
    local_1b0.constant_ = -1;
    local_1b0.defaultVal = 0;
    local_1c8.num_elts = -1;
    local_1c8._4_4_ = 0;
    local_1e0 = (FadCst<int>)0xffffffff;
    local_88 = (FadCst<int>)local_1d0;
    local_80 = (FadCst<int> *)local_1e8;
    local_118 = local_230;
    local_110._0_8_ = &local_200;
    local_110._8_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_1b8;
    local_e0 = local_230;
    local_d8 = local_230;
    local_d0 = local_230;
    local_a0 = local_b0;
    local_98 = local_b0;
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 3) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 4)) {
      local_248 = (Fad<double> *)&local_88;
      local_218 = (FadCst<int>)&local_50;
      local_1f0 = (FadCst<int>)&local_50;
      local_1d8 = (FadCst<int>)&local_50;
      local_1c8.ptr_to_data = &local_50.val_;
      local_1a8 = (FadCst<int>)&local_50;
      FStack_180 = (FadCst<int>)&local_50;
      local_f0 = (FadCst<int>)&local_190;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_248 = (Fad<double> *)&local_88;
    local_218 = (FadCst<int>)&local_50;
    local_1f0 = (FadCst<int>)&local_50;
    local_1d8 = (FadCst<int>)&local_50;
    local_1c8.ptr_to_data = &local_50.val_;
    local_1a8 = (FadCst<int>)&local_50;
    FStack_180 = (FadCst<int>)&local_50;
    local_f0 = (FadCst<int>)&local_190;
    Fad<double>::operator=
              (dphi->fElem + (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 3 + 2,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>
                *)&local_210);
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 5)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    pFVar2 = dphi->fElem;
    pFVar2[lVar6 * 4].val_ = 0.0;
    if (pFVar2[lVar6 * 4].dx_.num_elts != 0) {
      local_260._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x0;
      Vector<double>::operator=(&pFVar2[lVar6 * 4].dx_,(double *)local_260);
    }
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 5)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    pFVar2 = dphi->fElem;
    pFVar2[lVar6 * 4 + 1].val_ = 0.0;
    if (pFVar2[lVar6 * 4 + 1].dx_.num_elts != 0) {
      local_260._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x0;
      Vector<double>::operator=(&pFVar2[lVar6 * 4 + 1].dx_,(double *)local_260);
    }
    local_190.fadexpr_.right_ =
         (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
          *)0x4;
    local_260._8_8_ = 2.12199579047121e-314;
    FStack_250 = (FadCst<int>)&local_190;
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 3) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 5)) {
      FStack_180 = (FadCst<int>)&local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    FStack_180 = (FadCst<int>)&local_50;
    Fad<double>::operator=
              (dphi->fElem + (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 4 + 2,
               (FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
                *)local_260);
    local_260._8_8_ = 2.12199579047121e-314;
    FStack_250 = (FadCst<int>)&local_160;
    local_240 = (undefined1  [8])&local_140;
    local_190.fadexpr_.right_ =
         (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
          *)0xffffffff;
    local_220 = (FadCst<int>)&local_190;
    local_1b8 = (FadCst<int>)local_228;
    local_238 = (FadCst<int>)&local_200;
    local_228 = (undefined1  [8])local_240;
    local_200.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_260;
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 6)) {
      local_200.fadexpr_.right_ = &local_50;
      FStack_180 = (FadCst<int>)&local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_200.fadexpr_.right_ = &local_50;
    FStack_180 = (FadCst<int>)&local_50;
    Fad<double>::operator=
              (dphi->fElem + (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 5,
               (FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)&local_1b8);
    local_1d0 = (undefined1  [8])&local_140;
    local_210.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_1d0;
    local_190.fadexpr_.right_ =
         (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
          *)0xffffffff;
    local_220.constant_ = -1;
    local_220.defaultVal = 0;
    local_1e8 = (undefined1  [8])&local_190;
    local_1e0 = (FadCst<int>)local_228;
    local_1b8 = (FadCst<int>)&local_210;
    local_1b0 = (FadCst<int>)local_1e8;
    local_238.constant_ = -1;
    local_238.defaultVal = 0;
    local_260._8_8_ = 2.0;
    FStack_250 = (FadCst<int>)0x0;
    local_248 = (Fad<double> *)local_240;
    local_200.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_1b8;
    local_200.fadexpr_.right_ = (Fad<double> *)local_260;
    local_1c8._0_8_ = local_1d0;
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 6)) {
      local_230 = (FadCst<int>)&local_50;
      local_218 = (FadCst<int>)&local_50;
      FStack_180 = (FadCst<int>)&local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_230 = (FadCst<int>)&local_50;
    local_218 = (FadCst<int>)&local_50;
    FStack_180 = (FadCst<int>)&local_50;
    Fad<double>::operator=
              (dphi->fElem + (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 5 + 1,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)&local_200);
    local_1b8 = (FadCst<int>)local_1d0;
    local_190.fadexpr_.right_ =
         (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
          *)local_78;
    local_210.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_160;
    local_1a0._0_8_ = &local_140;
    local_210.fadexpr_.right_ = (Fad<double> *)local_1a0;
    local_220.constant_ = -1;
    local_220.defaultVal = 0;
    local_238.constant_ = -1;
    local_238.defaultVal = 0;
    local_168 = (FadCst<int>)local_240;
    local_1e8 = (undefined1  [8])&local_210;
    local_1e0 = (FadCst<int>)&local_170;
    local_1d0 = (undefined1  [8])&local_190;
    local_1c8._0_8_ = local_1e8;
    local_200.fadexpr_.right_ = (Fad<double> *)0x2;
    local_260._8_8_ = 2.0;
    FStack_250 = (FadCst<int>)0x0;
    local_260._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_1b8;
    local_1b0 = (FadCst<int>)&local_200;
    local_1a0._8_8_ = local_1a0._0_8_;
    FStack_180 = (FadCst<int>)local_210.fadexpr_.left_;
    local_170 = (FadCst<int>)local_228;
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 3) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 6)) {
      local_230 = (FadCst<int>)&local_50;
      local_218 = (FadCst<int>)&local_50;
      local_1f0 = (FadCst<int>)&local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_230 = (FadCst<int>)&local_50;
    local_218 = (FadCst<int>)&local_50;
    local_1f0 = (FadCst<int>)&local_50;
    Fad<double>::operator=
              (dphi->fElem + (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 5 + 2,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>
                *)local_260);
    local_1d0 = (undefined1  [8])&local_160;
    local_190.fadexpr_.right_ =
         (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
          *)0xffffffff;
    local_220.constant_ = -1;
    local_220.defaultVal = 0;
    local_1e8 = (undefined1  [8])&local_190;
    local_1b8 = (FadCst<int>)local_1d0;
    local_1b0 = (FadCst<int>)local_1e8;
    local_238.constant_ = -1;
    local_238.defaultVal = 0;
    local_260._8_8_ = 2.0;
    FStack_250 = (FadCst<int>)0x0;
    local_248 = (Fad<double> *)local_240;
    local_200.fadexpr_.right_ = (Fad<double> *)local_260;
    local_1e0 = (FadCst<int>)local_228;
    local_1c8._0_8_ = local_1d0;
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 7)) {
      local_230 = (FadCst<int>)&local_50;
      local_218 = (FadCst<int>)&local_50;
      local_200.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_1b8;
      FStack_180 = (FadCst<int>)&local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_230 = (FadCst<int>)&local_50;
    local_218 = (FadCst<int>)&local_50;
    local_200.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_1b8;
    FStack_180 = (FadCst<int>)&local_50;
    Fad<double>::operator=
              (dphi->fElem + (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 6,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)&local_200);
    local_260._8_8_ = 4.94065645841247e-324;
    FStack_250 = (FadCst<int>)&local_140;
    local_240 = (undefined1  [8])&local_160;
    local_190.fadexpr_.right_ =
         (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
          *)0xffffffff;
    local_238 = (FadCst<int>)&local_200;
    local_228 = (undefined1  [8])local_240;
    local_220 = (FadCst<int>)&local_190;
    local_200.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_260;
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 7)) {
      local_200.fadexpr_.right_ = &local_50;
      FStack_180 = (FadCst<int>)&local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_200.fadexpr_.right_ = &local_50;
    FStack_180 = (FadCst<int>)&local_50;
    Fad<double>::operator=
              (dphi->fElem + (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 6 + 1,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)local_228);
    local_210.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_160;
    local_238.constant_ = -1;
    local_238.defaultVal = 0;
    local_200.fadexpr_.right_ = (Fad<double> *)0xffffffff;
    local_190.fadexpr_.right_ =
         (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
          *)0x4000000000000000;
    FStack_180.constant_ = 0;
    FStack_180.defaultVal = 0;
    local_178 = (FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                 *)local_1a0;
    local_1e8 = (undefined1  [8])&local_210;
    local_260._8_8_ = -0.5;
    FStack_250 = (FadCst<int>)0x0;
    local_248 = (Fad<double> *)local_1e8;
    local_1d0 = (undefined1  [8])&local_140;
    local_1c8._0_8_ = local_260;
    local_220.constant_ = -1;
    local_220.defaultVal = 0;
    local_218 = (FadCst<int>)local_1d0;
    local_210.fadexpr_.right_ = (Fad<double> *)local_210.fadexpr_.left_;
    local_1e0 = (FadCst<int>)&local_190;
    local_1b8 = (FadCst<int>)local_228;
    local_1b0 = (FadCst<int>)&local_50;
    local_1a0._0_8_ = (Fad<double> *)local_240;
    local_1a0._8_8_ = &local_200;
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 3) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 7)) {
      local_230 = (FadCst<int>)&local_50;
      local_1f0 = (FadCst<int>)&local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_230 = (FadCst<int>)&local_50;
    local_1f0 = (FadCst<int>)&local_50;
    Fad<double>::operator=
              (dphi->fElem + (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 6 + 2,
               (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>_>_>_>_>,_Fad<double>_>_>
                *)&local_1b8);
    local_260._8_8_ = 4.94065645841247e-324;
    FStack_250 = (FadCst<int>)&local_160;
    local_200.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_260;
    local_240 = (undefined1  [8])&local_140;
    local_190.fadexpr_.right_ =
         (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
          *)0xffffffff;
    local_228 = (undefined1  [8])local_240;
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 8)) {
      local_238 = (FadCst<int>)&local_200;
      local_220 = (FadCst<int>)&local_190;
      local_200.fadexpr_.right_ = &local_50;
      FStack_180 = (FadCst<int>)&local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_238 = (FadCst<int>)&local_200;
    local_220 = (FadCst<int>)&local_190;
    local_200.fadexpr_.right_ = &local_50;
    FStack_180 = (FadCst<int>)&local_50;
    Fad<double>::operator=
              (dphi->fElem + (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 7,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)local_228);
    local_1d0 = (undefined1  [8])&local_140;
    local_190.fadexpr_.right_ =
         (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
          *)0xffffffff;
    local_220.constant_ = -1;
    local_220.defaultVal = 0;
    local_1e8 = (undefined1  [8])&local_190;
    local_1b8 = (FadCst<int>)local_1d0;
    local_1b0 = (FadCst<int>)local_1e8;
    local_238.constant_ = -1;
    local_238.defaultVal = 0;
    local_260._8_8_ = 2.0;
    FStack_250 = (FadCst<int>)0x0;
    local_248 = (Fad<double> *)local_240;
    local_200.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_1b8;
    local_200.fadexpr_.right_ = (Fad<double> *)local_260;
    local_1e0 = (FadCst<int>)local_228;
    local_1c8._0_8_ = local_1d0;
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 8)) {
      local_230 = (FadCst<int>)&local_50;
      local_218 = (FadCst<int>)&local_50;
      FStack_180 = (FadCst<int>)&local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_230 = (FadCst<int>)&local_50;
    local_218 = (FadCst<int>)&local_50;
    FStack_180 = (FadCst<int>)&local_50;
    Fad<double>::operator=
              (dphi->fElem + (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 7 + 1,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)&local_200);
    local_210.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_140;
    local_238.constant_ = -1;
    local_238.defaultVal = 0;
    local_200.fadexpr_.right_ = (Fad<double> *)0xffffffff;
    local_190.fadexpr_.right_ =
         (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
          *)0x4000000000000000;
    FStack_180.constant_ = 0;
    FStack_180.defaultVal = 0;
    local_178 = (FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>
                 *)local_1a0;
    local_1e8 = (undefined1  [8])&local_210;
    local_1e0 = (FadCst<int>)&local_190;
    local_260._8_8_ = -0.5;
    FStack_250 = (FadCst<int>)0x0;
    local_248 = (Fad<double> *)local_1e8;
    local_1d0 = (undefined1  [8])&local_160;
    local_220.constant_ = -1;
    local_220.defaultVal = 0;
    local_218 = (FadCst<int>)local_1d0;
    local_210.fadexpr_.right_ = (Fad<double> *)local_210.fadexpr_.left_;
    local_1c8._0_8_ = (Fad<double> *)local_260;
    local_1b8 = (FadCst<int>)local_228;
    local_1a0._0_8_ = (Fad<double> *)local_240;
    local_1a0._8_8_ = &local_200;
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 3) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 8)) {
      local_230 = (FadCst<int>)&local_50;
      local_1f0 = (FadCst<int>)&local_50;
      local_1b0 = (FadCst<int>)&local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_230 = (FadCst<int>)&local_50;
    local_1f0 = (FadCst<int>)&local_50;
    local_1b0 = (FadCst<int>)&local_50;
    Fad<double>::operator=
              (dphi->fElem + (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 7 + 2,
               (FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<double>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>_>_>_>_>,_Fad<double>_>_>
                *)&local_1b8);
    local_1d0 = (undefined1  [8])&local_160;
    local_210.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_1d0;
    local_190.fadexpr_.right_ =
         (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
          *)0xffffffff;
    local_220.constant_ = -1;
    local_220.defaultVal = 0;
    local_1e8 = (undefined1  [8])&local_190;
    local_1b8 = (FadCst<int>)&local_210;
    local_1b0 = (FadCst<int>)local_1e8;
    local_238.constant_ = -1;
    local_238.defaultVal = 0;
    local_260._8_8_ = 2.0;
    FStack_250 = (FadCst<int>)0x0;
    local_200.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_1b8;
    local_1c8._0_8_ = local_1d0;
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 9)) {
      local_248 = (Fad<double> *)local_240;
      local_230 = (FadCst<int>)&local_50;
      local_218 = (FadCst<int>)&local_50;
      local_200.fadexpr_.right_ = (Fad<double> *)local_260;
      local_1e0 = (FadCst<int>)local_228;
      FStack_180 = (FadCst<int>)&local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_248 = (Fad<double> *)local_240;
    local_230 = (FadCst<int>)&local_50;
    local_218 = (FadCst<int>)&local_50;
    local_200.fadexpr_.right_ = (Fad<double> *)local_260;
    local_1e0 = (FadCst<int>)local_228;
    FStack_180 = (FadCst<int>)&local_50;
    Fad<double>::operator=
              (dphi->fElem + (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 8,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<FadExpr<FadUnaryMin<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)&local_200);
    local_260._8_8_ = 2.12199579047121e-314;
    FStack_250 = (FadCst<int>)&local_140;
    local_200.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_260;
    local_240 = (undefined1  [8])&local_160;
    local_190.fadexpr_.right_ =
         (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
          *)0xffffffff;
    local_220 = (FadCst<int>)&local_190;
    local_238 = (FadCst<int>)&local_200;
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 9)) {
      local_228 = (undefined1  [8])local_240;
      local_200.fadexpr_.right_ = &local_50;
      local_1b8 = (FadCst<int>)local_228;
      FStack_180 = (FadCst<int>)&local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_228 = (undefined1  [8])local_240;
    local_200.fadexpr_.right_ = &local_50;
    local_1b8 = (FadCst<int>)local_228;
    FStack_180 = (FadCst<int>)&local_50;
    Fad<double>::operator=
              (dphi->fElem + (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 8 + 1,
               (FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)&local_1b8);
    local_190.fadexpr_.right_ =
         (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
          *)local_78;
    local_1e8 = (undefined1  [8])&local_210;
    local_1e0 = (FadCst<int>)&local_170;
    local_210.fadexpr_.right_ = &local_140;
    local_1a0._0_8_ = &local_160;
    local_210.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_1a0;
    local_220.constant_ = -1;
    local_220.defaultVal = 0;
    local_238.constant_ = -1;
    local_238.defaultVal = 0;
    local_1d0 = (undefined1  [8])&local_190;
    local_1c8._0_8_ = local_1e8;
    local_200.fadexpr_.right_ = (Fad<double> *)0x2;
    local_1b8 = (FadCst<int>)local_1d0;
    local_260._8_8_ = 2.0;
    FStack_250 = (FadCst<int>)0x0;
    local_260._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_1b8;
    local_1b0 = (FadCst<int>)&local_200;
    local_1a0._8_8_ = local_1a0._0_8_;
    FStack_180 = (FadCst<int>)local_210.fadexpr_.right_;
    local_170 = (FadCst<int>)local_228;
    local_168 = (FadCst<int>)local_240;
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 3) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 9)) {
      local_230 = (FadCst<int>)&local_50;
      local_218 = (FadCst<int>)&local_50;
      local_1f0 = (FadCst<int>)&local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_230 = (FadCst<int>)&local_50;
    local_218 = (FadCst<int>)&local_50;
    local_1f0 = (FadCst<int>)&local_50;
    Fad<double>::operator=
              (dphi->fElem + (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 8 + 2,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>
                *)local_260);
    local_260._8_8_ = 2.12199579047121e-314;
    FStack_250 = (FadCst<int>)&local_160;
    local_190.fadexpr_.right_ =
         (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
          *)0xffffffff;
    local_220 = (FadCst<int>)&local_190;
    local_240 = (undefined1  [8])&local_50;
    local_200.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_260;
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 10)) {
      local_238 = (FadCst<int>)&local_200;
      local_228 = (undefined1  [8])local_240;
      local_200.fadexpr_.right_ = &local_50;
      local_1b8 = (FadCst<int>)local_228;
      FStack_180 = (FadCst<int>)&local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_238 = (FadCst<int>)&local_200;
    local_228 = (undefined1  [8])local_240;
    local_200.fadexpr_.right_ = &local_50;
    local_1b8 = (FadCst<int>)local_228;
    FStack_180 = (FadCst<int>)&local_50;
    Fad<double>::operator=
              (dphi->fElem + (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 9,
               (FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)&local_1b8);
    local_260._8_8_ = 2.12199579047121e-314;
    FStack_250 = (FadCst<int>)&local_140;
    local_190.fadexpr_.right_ =
         (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
          *)0xffffffff;
    local_220 = (FadCst<int>)&local_190;
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 10)) {
      local_240 = (undefined1  [8])&local_50;
      local_238 = (FadCst<int>)&local_200;
      local_228 = (undefined1  [8])local_240;
      local_200.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_260;
      local_200.fadexpr_.right_ = &local_50;
      local_1b8 = (FadCst<int>)local_228;
      FStack_180 = (FadCst<int>)&local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_240 = (undefined1  [8])&local_50;
    local_238 = (FadCst<int>)&local_200;
    local_228 = (undefined1  [8])local_240;
    local_200.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_260;
    local_200.fadexpr_.right_ = &local_50;
    local_1b8 = (FadCst<int>)local_228;
    FStack_180 = (FadCst<int>)&local_50;
    Fad<double>::operator=
              (dphi->fElem + (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 9 + 1,
               (FadExpr<FadUnaryMin<FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>
                *)&local_1b8);
    local_260._8_8_ = 4.94065645841247e-324;
    FStack_250 = (FadCst<int>)&local_140;
    local_220.constant_ = -1;
    local_220.defaultVal = 0;
    local_238.constant_ = -1;
    local_238.defaultVal = 0;
    local_210.fadexpr_.right_ = (Fad<double> *)local_1a0;
    local_190.fadexpr_.right_ =
         (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
          *)0xffffffff;
    FStack_180 = (FadCst<int>)&local_210;
    local_1e8 = (undefined1  [8])&local_160;
    local_1c8._0_8_ = local_1e8;
    local_200.fadexpr_.right_ = (Fad<double> *)0x2;
    local_1b8 = (FadCst<int>)local_1d0;
    local_210.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)FStack_250;
    local_1e0 = (FadCst<int>)&local_190;
    local_1d0 = (undefined1  [8])local_260;
    local_1a0._0_8_ = local_228;
    local_1a0._8_8_ = (Fad<double> *)local_240;
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 3) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 10)) {
      local_230 = (FadCst<int>)&local_50;
      local_218 = (FadCst<int>)&local_50;
      local_1f0 = (FadCst<int>)&local_50;
      local_1b0 = (FadCst<int>)&local_200;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_230 = (FadCst<int>)&local_50;
    local_218 = (FadCst<int>)&local_50;
    local_1f0 = (FadCst<int>)&local_50;
    local_1b0 = (FadCst<int>)&local_200;
    Fad<double>::operator=
              (dphi->fElem + (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 9 + 2,
               (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadCst<int>,_FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
                *)&local_1b8);
    local_260._8_8_ = 2.12199579047121e-314;
    FStack_250 = (FadCst<int>)&local_160;
    local_190.fadexpr_.right_ =
         (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
          *)0xffffffff;
    local_228 = (undefined1  [8])local_240;
    local_220 = (FadCst<int>)&local_190;
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0xb)) {
      local_240 = (undefined1  [8])&local_50;
      local_238 = (FadCst<int>)&local_200;
      local_200.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_260;
      local_200.fadexpr_.right_ = &local_50;
      FStack_180 = (FadCst<int>)&local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_240 = (undefined1  [8])&local_50;
    local_238 = (FadCst<int>)&local_200;
    local_200.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_260;
    local_200.fadexpr_.right_ = &local_50;
    FStack_180 = (FadCst<int>)&local_50;
    Fad<double>::operator=
              (dphi->fElem + (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 10,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)local_228);
    local_260._8_8_ = 4.94065645841247e-324;
    FStack_250 = (FadCst<int>)&local_140;
    local_190.fadexpr_.right_ =
         (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
          *)0xffffffff;
    local_228 = (undefined1  [8])local_240;
    local_240 = (undefined1  [8])&local_200;
    local_238 = (FadCst<int>)&local_50;
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0xb)) {
      local_220 = (FadCst<int>)&local_190;
      local_200.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_260;
      local_200.fadexpr_.right_ = &local_50;
      FStack_180 = (FadCst<int>)&local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_220 = (FadCst<int>)&local_190;
    local_200.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_260;
    local_200.fadexpr_.right_ = &local_50;
    FStack_180 = (FadCst<int>)&local_50;
    Fad<double>::operator=
              (dphi->fElem + (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 10 + 1
               ,(FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                 *)local_228);
    local_260._8_8_ = 4.94065645841247e-324;
    FStack_250 = (FadCst<int>)&local_140;
    local_220.constant_ = -1;
    local_220.defaultVal = 0;
    local_238.constant_ = -1;
    local_238.defaultVal = 0;
    local_210.fadexpr_.right_ = (Fad<double> *)local_1a0;
    local_190.fadexpr_.right_ =
         (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
          *)0xffffffff;
    FStack_180 = (FadCst<int>)&local_210;
    local_1e8 = (undefined1  [8])&local_160;
    local_1c8._0_8_ = local_1e8;
    local_200.fadexpr_.right_ = (Fad<double> *)0x2;
    local_1b8 = (FadCst<int>)local_1d0;
    local_210.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)FStack_250;
    local_1a0._0_8_ =
         (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
          *)local_228;
    local_1a0._8_8_ = (Fad<double> *)local_240;
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 3) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0xb)) {
      local_230 = (FadCst<int>)&local_50;
      local_218 = (FadCst<int>)&local_50;
      local_1f0 = (FadCst<int>)&local_50;
      local_1e0 = (FadCst<int>)&local_190;
      local_1d0 = (undefined1  [8])local_260;
      local_1b0 = (FadCst<int>)&local_200;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_230 = (FadCst<int>)&local_50;
    local_218 = (FadCst<int>)&local_50;
    local_1f0 = (FadCst<int>)&local_50;
    local_1e0 = (FadCst<int>)&local_190;
    local_1d0 = (undefined1  [8])local_260;
    local_1b0 = (FadCst<int>)&local_200;
    Fad<double>::operator=
              (dphi->fElem + (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 10 + 2
               ,(FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryMinus<FadCst<int>,_FadExpr<FadBinaryDiv<Fad<double>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
                 *)&local_1b8);
    local_260._8_8_ = 2.12199579047121e-314;
    FStack_250 = (FadCst<int>)&local_160;
    local_190.fadexpr_.right_ =
         (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
          *)0xffffffff;
    local_228 = (undefined1  [8])local_240;
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0xc)) {
      local_240 = (undefined1  [8])&local_50;
      local_238 = (FadCst<int>)&local_200;
      local_220 = (FadCst<int>)&local_190;
      local_200.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_260;
      local_200.fadexpr_.right_ = &local_50;
      FStack_180 = (FadCst<int>)&local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_240 = (undefined1  [8])&local_50;
    local_238 = (FadCst<int>)&local_200;
    local_220 = (FadCst<int>)&local_190;
    local_200.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_260;
    local_200.fadexpr_.right_ = &local_50;
    FStack_180 = (FadCst<int>)&local_50;
    Fad<double>::operator=
              (dphi->fElem + (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 0xb,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)local_228);
    local_260._8_8_ = 2.12199579047121e-314;
    FStack_250 = (FadCst<int>)&local_140;
    local_190.fadexpr_.right_ =
         (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
          *)0xffffffff;
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0xc)) {
      local_240 = (undefined1  [8])&local_50;
      local_238 = (FadCst<int>)&local_200;
      local_228 = (undefined1  [8])local_240;
      local_220 = (FadCst<int>)&local_190;
      local_200.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_260;
      local_200.fadexpr_.right_ = &local_50;
      FStack_180 = (FadCst<int>)&local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_240 = (undefined1  [8])&local_50;
    local_238 = (FadCst<int>)&local_200;
    local_228 = (undefined1  [8])local_240;
    local_220 = (FadCst<int>)&local_190;
    local_200.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_260;
    local_200.fadexpr_.right_ = &local_50;
    FStack_180 = (FadCst<int>)&local_50;
    Fad<double>::operator=
              (dphi->fElem +
               (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 0xb + 1,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)local_228);
    local_260._8_8_ = 4.94065645841247e-324;
    FStack_250 = (FadCst<int>)&local_160;
    local_210.fadexpr_.right_ = &local_140;
    local_190.fadexpr_.right_ =
         (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
          *)0xffffffff;
    local_220.constant_ = -1;
    local_220.defaultVal = 0;
    local_1e8 = (undefined1  [8])&local_210;
    local_1e0 = (FadCst<int>)local_1a0;
    local_1b8 = (FadCst<int>)local_1d0;
    local_1b0 = (FadCst<int>)local_1e8;
    local_238.constant_ = 2;
    local_238.defaultVal = 0;
    local_200.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_1b8;
    local_200.fadexpr_.right_ = (Fad<double> *)local_240;
    local_210.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)FStack_250;
    local_1c8._0_8_ = local_210.fadexpr_.right_;
    local_1a0._0_8_ = &local_190;
    local_1a0._8_8_ =
         (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
          *)local_228;
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 3) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0xc)) {
      local_230 = (FadCst<int>)&local_50;
      local_218 = (FadCst<int>)&local_50;
      local_1d0 = (undefined1  [8])local_260;
      FStack_180 = (FadCst<int>)&local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_230 = (FadCst<int>)&local_50;
    local_218 = (FadCst<int>)&local_50;
    local_1d0 = (undefined1  [8])local_260;
    FStack_180 = (FadCst<int>)&local_50;
    Fad<double>::operator=
              (dphi->fElem +
               (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 0xb + 2,
               (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
                *)&local_200);
    local_260._8_8_ = 4.94065645841247e-324;
    FStack_250 = (FadCst<int>)&local_160;
    local_190.fadexpr_.right_ =
         (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
          *)0xffffffff;
    local_240 = (undefined1  [8])&local_200;
    local_228 = (undefined1  [8])local_240;
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0xd)) {
      local_238 = (FadCst<int>)&local_50;
      local_220 = (FadCst<int>)&local_190;
      local_200.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_260;
      local_200.fadexpr_.right_ = &local_50;
      FStack_180 = (FadCst<int>)&local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_238 = (FadCst<int>)&local_50;
    local_220 = (FadCst<int>)&local_190;
    local_200.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_260;
    local_200.fadexpr_.right_ = &local_50;
    FStack_180 = (FadCst<int>)&local_50;
    Fad<double>::operator=
              (dphi->fElem + (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 0xc,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)local_228);
    local_260._8_8_ = 2.12199579047121e-314;
    FStack_250 = (FadCst<int>)&local_140;
    local_190.fadexpr_.right_ =
         (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
          *)0xffffffff;
    local_238 = (FadCst<int>)&local_200;
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0xd)) {
      local_240 = (undefined1  [8])&local_50;
      local_228 = (undefined1  [8])local_240;
      local_220 = (FadCst<int>)&local_190;
      local_200.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_260;
      local_200.fadexpr_.right_ = &local_50;
      FStack_180 = (FadCst<int>)&local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_240 = (undefined1  [8])&local_50;
    local_228 = (undefined1  [8])local_240;
    local_220 = (FadCst<int>)&local_190;
    local_200.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)local_260;
    local_200.fadexpr_.right_ = &local_50;
    FStack_180 = (FadCst<int>)&local_50;
    Fad<double>::operator=
              (dphi->fElem +
               (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 0xc + 1,
               (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>
                *)local_228);
    local_260._8_8_ = 4.94065645841247e-324;
    FStack_250 = (FadCst<int>)&local_160;
    local_210.fadexpr_.right_ = &local_140;
    local_190.fadexpr_.right_ =
         (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
          *)0xffffffff;
    local_220.constant_ = -1;
    local_220.defaultVal = 0;
    local_1e8 = (undefined1  [8])&local_210;
    local_1e0 = (FadCst<int>)local_1a0;
    local_1b8 = (FadCst<int>)local_1d0;
    local_1b0 = (FadCst<int>)local_1e8;
    local_238.constant_ = 2;
    local_238.defaultVal = 0;
    local_200.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)&local_1b8;
    local_210.fadexpr_.left_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)FStack_250;
    local_200.fadexpr_.right_ = (Fad<double> *)local_240;
    local_1c8._0_8_ = local_210.fadexpr_.right_;
    local_1a0._8_8_ =
         (FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>
          *)local_228;
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 3) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0xd)) {
      local_230 = (FadCst<int>)&local_50;
      local_218 = (FadCst<int>)&local_50;
      local_1d0 = (undefined1  [8])local_260;
      local_1a0._0_8_ = &local_190;
      FStack_180 = (FadCst<int>)&local_50;
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    local_230 = (FadCst<int>)&local_50;
    local_218 = (FadCst<int>)&local_50;
    local_1d0 = (undefined1  [8])local_260;
    local_1a0._0_8_ = &local_190;
    FStack_180 = (FadCst<int>)&local_50;
    Fad<double>::operator=
              (dphi->fElem +
               (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow * 0xc + 2,
               (FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_Fad<double>_>_>,_FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_>_>_>_>_>_>_>,_FadExpr<FadBinaryMul<FadCst<int>,_Fad<double>_>_>_>_>
                *)&local_200);
  }
  else {
    if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
       ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar2 = phi->fElem;
    pFVar2->val_ = 0.0;
    if ((pFVar2->dx_).num_elts != 0) {
      local_260._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x0;
      Vector<double>::operator=(&pFVar2->dx_,(double *)local_260);
    }
    if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
       ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar2 = phi->fElem;
    pFVar2[1].val_ = 0.0;
    if (pFVar2[1].dx_.num_elts != 0) {
      local_260._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x0;
      Vector<double>::operator=(&pFVar2[1].dx_,(double *)local_260);
    }
    if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 3) ||
       ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar2 = phi->fElem;
    pFVar2[2].val_ = 0.0;
    if (pFVar2[2].dx_.num_elts != 0) {
      local_260._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x0;
      Vector<double>::operator=(&pFVar2[2].dx_,(double *)local_260);
    }
    if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 4) ||
       ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar2 = phi->fElem;
    pFVar2[3].val_ = 0.0;
    if (pFVar2[3].dx_.num_elts != 0) {
      local_260._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x0;
      Vector<double>::operator=(&pFVar2[3].dx_,(double *)local_260);
    }
    if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 5) ||
       ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar2 = phi->fElem;
    pFVar2[4].val_ = 1.0;
    if (pFVar2[4].dx_.num_elts != 0) {
      local_260._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x0;
      Vector<double>::operator=(&pFVar2[4].dx_,(double *)local_260);
    }
    if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 6) ||
       ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar2 = phi->fElem;
    pFVar2[5].val_ = 0.0;
    if (pFVar2[5].dx_.num_elts != 0) {
      local_260._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x0;
      Vector<double>::operator=(&pFVar2[5].dx_,(double *)local_260);
    }
    if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 7) ||
       ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar2 = phi->fElem;
    pFVar2[6].val_ = 0.0;
    if (pFVar2[6].dx_.num_elts != 0) {
      local_260._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x0;
      Vector<double>::operator=(&pFVar2[6].dx_,(double *)local_260);
    }
    if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 8) ||
       ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar2 = phi->fElem;
    pFVar2[7].val_ = 0.0;
    if (pFVar2[7].dx_.num_elts != 0) {
      local_260._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x0;
      Vector<double>::operator=(&pFVar2[7].dx_,(double *)local_260);
    }
    if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 9) ||
       ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar2 = phi->fElem;
    pFVar2[8].val_ = 0.0;
    if (pFVar2[8].dx_.num_elts != 0) {
      local_260._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x0;
      Vector<double>::operator=(&pFVar2[8].dx_,(double *)local_260);
    }
    if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 10) ||
       ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar2 = phi->fElem;
    pFVar2[9].val_ = 0.0;
    if (pFVar2[9].dx_.num_elts != 0) {
      local_260._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x0;
      Vector<double>::operator=(&pFVar2[9].dx_,(double *)local_260);
    }
    if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 0xb) ||
       ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar2 = phi->fElem;
    pFVar2[10].val_ = 0.0;
    if (pFVar2[10].dx_.num_elts != 0) {
      local_260._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x0;
      Vector<double>::operator=(&pFVar2[10].dx_,(double *)local_260);
    }
    if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 0xc) ||
       ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar2 = phi->fElem;
    pFVar2[0xb].val_ = 0.0;
    if (pFVar2[0xb].dx_.num_elts != 0) {
      local_260._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x0;
      Vector<double>::operator=(&pFVar2[0xb].dx_,(double *)local_260);
    }
    if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 0xd) ||
       ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar2 = phi->fElem;
    pFVar2[0xc].val_ = 0.0;
    if (pFVar2[0xc].dx_.num_elts != 0) {
      local_260._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x0;
      Vector<double>::operator=(&pFVar2[0xc].dx_,(double *)local_260);
    }
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar2 = dphi->fElem;
    pFVar2->val_ = 0.0;
    if ((pFVar2->dx_).num_elts != 0) {
      local_260._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x0;
      Vector<double>::operator=(&pFVar2->dx_,(double *)local_260);
    }
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar2 = dphi->fElem;
    pFVar2[1].val_ = 0.0;
    if (pFVar2[1].dx_.num_elts != 0) {
      local_260._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x0;
      Vector<double>::operator=(&pFVar2[1].dx_,(double *)local_260);
    }
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 3) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    pFVar2 = dphi->fElem;
    pFVar2[2].val_ = -0.25;
    if (pFVar2[2].dx_.num_elts != 0) {
      local_260._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x0;
      Vector<double>::operator=(&pFVar2[2].dx_,(double *)local_260);
    }
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    pFVar2 = dphi->fElem;
    pFVar2[lVar6].val_ = 0.0;
    if (pFVar2[lVar6].dx_.num_elts != 0) {
      local_260._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x0;
      Vector<double>::operator=(&pFVar2[lVar6].dx_,(double *)local_260);
    }
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    pFVar2 = dphi->fElem;
    pFVar2[lVar6 + 1].val_ = 0.0;
    if (pFVar2[lVar6 + 1].dx_.num_elts != 0) {
      local_260._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x0;
      Vector<double>::operator=(&pFVar2[lVar6 + 1].dx_,(double *)local_260);
    }
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 3) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    pFVar2 = dphi->fElem;
    pFVar2[lVar6 + 2].val_ = -0.25;
    if (pFVar2[lVar6 + 2].dx_.num_elts != 0) {
      local_260._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x0;
      Vector<double>::operator=(&pFVar2[lVar6 + 2].dx_,(double *)local_260);
    }
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 3)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    pFVar2 = dphi->fElem;
    pFVar2[lVar6 * 2].val_ = 0.0;
    if (pFVar2[lVar6 * 2].dx_.num_elts != 0) {
      local_260._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x0;
      Vector<double>::operator=(&pFVar2[lVar6 * 2].dx_,(double *)local_260);
    }
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 3)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    pFVar2 = dphi->fElem;
    pFVar2[lVar6 * 2 + 1].val_ = 0.0;
    if (pFVar2[lVar6 * 2 + 1].dx_.num_elts != 0) {
      local_260._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x0;
      Vector<double>::operator=(&pFVar2[lVar6 * 2 + 1].dx_,(double *)local_260);
    }
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 3) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 3)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    pFVar2 = dphi->fElem;
    pFVar2[lVar6 * 2 + 2].val_ = -0.25;
    if (pFVar2[lVar6 * 2 + 2].dx_.num_elts != 0) {
      local_260._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x0;
      Vector<double>::operator=(&pFVar2[lVar6 * 2 + 2].dx_,(double *)local_260);
    }
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 4)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    pFVar2 = dphi->fElem;
    pFVar2[lVar6 * 3].val_ = 0.0;
    if (pFVar2[lVar6 * 3].dx_.num_elts != 0) {
      local_260._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x0;
      Vector<double>::operator=(&pFVar2[lVar6 * 3].dx_,(double *)local_260);
    }
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 4)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    pFVar2 = dphi->fElem;
    pFVar2[lVar6 * 3 + 1].val_ = 0.0;
    if (pFVar2[lVar6 * 3 + 1].dx_.num_elts != 0) {
      local_260._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x0;
      Vector<double>::operator=(&pFVar2[lVar6 * 3 + 1].dx_,(double *)local_260);
    }
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 3) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 4)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    pFVar2 = dphi->fElem;
    pFVar2[lVar6 * 3 + 2].val_ = -0.25;
    if (pFVar2[lVar6 * 3 + 2].dx_.num_elts != 0) {
      local_260._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x0;
      Vector<double>::operator=(&pFVar2[lVar6 * 3 + 2].dx_,(double *)local_260);
    }
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 5)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    pFVar2 = dphi->fElem;
    pFVar2[lVar6 * 4].val_ = 0.0;
    if (pFVar2[lVar6 * 4].dx_.num_elts != 0) {
      local_260._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x0;
      Vector<double>::operator=(&pFVar2[lVar6 * 4].dx_,(double *)local_260);
    }
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 5)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    pFVar2 = dphi->fElem;
    pFVar2[lVar6 * 4 + 1].val_ = 0.0;
    if (pFVar2[lVar6 * 4 + 1].dx_.num_elts != 0) {
      local_260._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x0;
      Vector<double>::operator=(&pFVar2[lVar6 * 4 + 1].dx_,(double *)local_260);
    }
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 3) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 5)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    pFVar2 = dphi->fElem;
    pFVar2[lVar6 * 4 + 2].val_ = 3.0;
    if (pFVar2[lVar6 * 4 + 2].dx_.num_elts != 0) {
      local_260._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x0;
      Vector<double>::operator=(&pFVar2[lVar6 * 4 + 2].dx_,(double *)local_260);
    }
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 6)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    pFVar2 = dphi->fElem;
    pFVar2[lVar6 * 5].val_ = 0.0;
    if (pFVar2[lVar6 * 5].dx_.num_elts != 0) {
      local_260._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x0;
      Vector<double>::operator=(&pFVar2[lVar6 * 5].dx_,(double *)local_260);
    }
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 6)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    pFVar2 = dphi->fElem;
    pFVar2[lVar6 * 5 + 1].val_ = 0.5;
    if (pFVar2[lVar6 * 5 + 1].dx_.num_elts != 0) {
      local_260._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x0;
      Vector<double>::operator=(&pFVar2[lVar6 * 5 + 1].dx_,(double *)local_260);
    }
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 3) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 6)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    pFVar2 = dphi->fElem;
    pFVar2[lVar6 * 5 + 2].val_ = 0.5;
    if (pFVar2[lVar6 * 5 + 2].dx_.num_elts != 0) {
      local_260._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x0;
      Vector<double>::operator=(&pFVar2[lVar6 * 5 + 2].dx_,(double *)local_260);
    }
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 7)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    pFVar2 = dphi->fElem;
    pFVar2[lVar6 * 6].val_ = -0.5;
    if (pFVar2[lVar6 * 6].dx_.num_elts != 0) {
      local_260._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x0;
      Vector<double>::operator=(&pFVar2[lVar6 * 6].dx_,(double *)local_260);
    }
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 7)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    pFVar2 = dphi->fElem;
    pFVar2[lVar6 * 6 + 1].val_ = 0.0;
    if (pFVar2[lVar6 * 6 + 1].dx_.num_elts != 0) {
      local_260._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x0;
      Vector<double>::operator=(&pFVar2[lVar6 * 6 + 1].dx_,(double *)local_260);
    }
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 3) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 7)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    pFVar2 = dphi->fElem;
    pFVar2[lVar6 * 6 + 2].val_ = 0.5;
    if (pFVar2[lVar6 * 6 + 2].dx_.num_elts != 0) {
      local_260._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x0;
      Vector<double>::operator=(&pFVar2[lVar6 * 6 + 2].dx_,(double *)local_260);
    }
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 8)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    pFVar2 = dphi->fElem;
    pFVar2[lVar6 * 7].val_ = 0.0;
    if (pFVar2[lVar6 * 7].dx_.num_elts != 0) {
      local_260._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x0;
      Vector<double>::operator=(&pFVar2[lVar6 * 7].dx_,(double *)local_260);
    }
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 8)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    pFVar2 = dphi->fElem;
    pFVar2[lVar6 * 7 + 1].val_ = -0.5;
    if (pFVar2[lVar6 * 7 + 1].dx_.num_elts != 0) {
      local_260._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x0;
      Vector<double>::operator=(&pFVar2[lVar6 * 7 + 1].dx_,(double *)local_260);
    }
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 3) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 8)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    pFVar2 = dphi->fElem;
    pFVar2[lVar6 * 7 + 2].val_ = 0.5;
    if (pFVar2[lVar6 * 7 + 2].dx_.num_elts != 0) {
      local_260._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x0;
      Vector<double>::operator=(&pFVar2[lVar6 * 7 + 2].dx_,(double *)local_260);
    }
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 9)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    pFVar2 = dphi->fElem;
    pFVar2[lVar6 * 8].val_ = 0.5;
    if (pFVar2[lVar6 * 8].dx_.num_elts != 0) {
      local_260._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x0;
      Vector<double>::operator=(&pFVar2[lVar6 * 8].dx_,(double *)local_260);
    }
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 9)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    pFVar2 = dphi->fElem;
    pFVar2[lVar6 * 8 + 1].val_ = 0.0;
    if (pFVar2[lVar6 * 8 + 1].dx_.num_elts != 0) {
      local_260._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x0;
      Vector<double>::operator=(&pFVar2[lVar6 * 8 + 1].dx_,(double *)local_260);
    }
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 3) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 9)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    pFVar2 = dphi->fElem;
    pFVar2[lVar6 * 8 + 2].val_ = 0.5;
    if (pFVar2[lVar6 * 8 + 2].dx_.num_elts != 0) {
      local_260._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x0;
      Vector<double>::operator=(&pFVar2[lVar6 * 8 + 2].dx_,(double *)local_260);
    }
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 10)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    pFVar2 = dphi->fElem;
    pFVar2[lVar6 * 9].val_ = -1.0;
    if (pFVar2[lVar6 * 9].dx_.num_elts != 0) {
      local_260._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x0;
      Vector<double>::operator=(&pFVar2[lVar6 * 9].dx_,(double *)local_260);
    }
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 10)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    pFVar2 = dphi->fElem;
    pFVar2[lVar6 * 9 + 1].val_ = -1.0;
    if (pFVar2[lVar6 * 9 + 1].dx_.num_elts != 0) {
      local_260._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x0;
      Vector<double>::operator=(&pFVar2[lVar6 * 9 + 1].dx_,(double *)local_260);
    }
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 3) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 10)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    pFVar2 = dphi->fElem;
    pFVar2[lVar6 * 9 + 2].val_ = -1.0;
    if (pFVar2[lVar6 * 9 + 2].dx_.num_elts != 0) {
      local_260._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x0;
      Vector<double>::operator=(&pFVar2[lVar6 * 9 + 2].dx_,(double *)local_260);
    }
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0xb)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    pFVar2 = dphi->fElem;
    pFVar2[lVar6 * 10].val_ = 1.0;
    if (pFVar2[lVar6 * 10].dx_.num_elts != 0) {
      local_260._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x0;
      Vector<double>::operator=(&pFVar2[lVar6 * 10].dx_,(double *)local_260);
    }
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0xb)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    pFVar2 = dphi->fElem;
    pFVar2[lVar6 * 10 + 1].val_ = -1.0;
    if (pFVar2[lVar6 * 10 + 1].dx_.num_elts != 0) {
      local_260._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x0;
      Vector<double>::operator=(&pFVar2[lVar6 * 10 + 1].dx_,(double *)local_260);
    }
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 3) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0xb)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    pFVar2 = dphi->fElem;
    pFVar2[lVar6 * 10 + 2].val_ = -1.0;
    if (pFVar2[lVar6 * 10 + 2].dx_.num_elts != 0) {
      local_260._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x0;
      Vector<double>::operator=(&pFVar2[lVar6 * 10 + 2].dx_,(double *)local_260);
    }
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0xc)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    pFVar2 = dphi->fElem;
    pFVar2[lVar6 * 0xb].val_ = 1.0;
    if (pFVar2[lVar6 * 0xb].dx_.num_elts != 0) {
      local_260._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x0;
      Vector<double>::operator=(&pFVar2[lVar6 * 0xb].dx_,(double *)local_260);
    }
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0xc)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    pFVar2 = dphi->fElem;
    pFVar2[lVar6 * 0xb + 1].val_ = 1.0;
    if (pFVar2[lVar6 * 0xb + 1].dx_.num_elts != 0) {
      local_260._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x0;
      Vector<double>::operator=(&pFVar2[lVar6 * 0xb + 1].dx_,(double *)local_260);
    }
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 3) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0xc)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    pFVar2 = dphi->fElem;
    pFVar2[lVar6 * 0xb + 2].val_ = -1.0;
    if (pFVar2[lVar6 * 0xb + 2].dx_.num_elts != 0) {
      local_260._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x0;
      Vector<double>::operator=(&pFVar2[lVar6 * 0xb + 2].dx_,(double *)local_260);
    }
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0xd)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    pFVar2 = dphi->fElem;
    pFVar2[lVar6 * 0xc].val_ = -1.0;
    if (pFVar2[lVar6 * 0xc].dx_.num_elts != 0) {
      local_260._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x0;
      Vector<double>::operator=(&pFVar2[lVar6 * 0xc].dx_,(double *)local_260);
    }
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0xd)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    pFVar2 = dphi->fElem;
    pFVar2[lVar6 * 0xc + 1].val_ = 1.0;
    if (pFVar2[lVar6 * 0xc + 1].dx_.num_elts != 0) {
      local_260._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x0;
      Vector<double>::operator=(&pFVar2[lVar6 * 0xc + 1].dx_,(double *)local_260);
    }
    if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 3) ||
       ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 0xd)) {
      TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    lVar6 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
    pFVar2 = dphi->fElem;
    pFVar2[lVar6 * 0xc + 2].val_ = -1.0;
    if (pFVar2[lVar6 * 0xc + 2].dx_.num_elts != 0) {
      local_260._0_8_ = (FadExpr<FadBinaryAdd<FadCst<int>,_Fad<double>_>_> *)0x0;
      Vector<double>::operator=(&pFVar2[lVar6 * 0xc + 2].dx_,(double *)local_260);
    }
  }
  Fad<double>::~Fad(&local_70);
  Fad<double>::~Fad(&local_50);
  Fad<double>::~Fad(&local_160);
  Fad<double>::~Fad(&local_140);
  return;
}

Assistant:

void TPZQuadraticPyramid::TShape(const TPZVec<T> &par,TPZFMatrix<T> &phi,TPZFMatrix<T> &dphi) {
    
    T qsi = par[0], eta = par[1], zeta = par[2];
    T check = zeta-1.;
    if(fabs(check) < 1.E-6)
    {
        phi(0,0)  = 0.;
        phi(1,0)  = 0.;
        phi(2,0)  = 0.;
        phi(3,0)  = 0.;
        phi(4,0)  = 1.;
        phi(5,0)  = 0.;
        phi(6,0)  = 0.;
        phi(7,0)  = 0.;
        phi(8,0)  = 0.;
        phi(9,0)  = 0.;
        phi(10,0) = 0.;
        phi(11,0) = 0.;
        phi(12,0) = 0.;
        
        dphi(0,0) = 0.;
        dphi(1,0) = 0.;
        dphi(2,0) = -0.25;
        
        dphi(0,1) = 0.;
        dphi(1,1) = 0.;
        dphi(2,1) = -0.25;
        
        dphi(0,2) = 0.;
        dphi(1,2) = 0.;
        dphi(2,2) = -0.25;
        
        dphi(0,3) = 0.;
        dphi(1,3) = 0.;
        dphi(2,3) = -0.25;
        
        dphi(0,4) = 0.;
        dphi(1,4) = 0.;
        dphi(2,4) = 3.;
        
        dphi(0,5) = 0.;
        dphi(1,5) = 0.5;
        dphi(2,5) = 0.5;
        
        dphi(0,6) = -0.5;
        dphi(1,6) = 0.;
        dphi(2,6) = 0.5;
        
        dphi(0,7) = 0.;
        dphi(1,7) = -0.5;
        dphi(2,7) = 0.5;
        
        dphi(0,8) = 0.5;
        dphi(1,8) = 0.;
        dphi(2,8) = 0.5;
        
        dphi(0,9) = -1.;
        dphi(1,9) = -1.;
        dphi(2,9) = -1.;
        
        dphi(0,10) = 1.;
        dphi(1,10) = -1.;
        dphi(2,10) = -1.;
        
        dphi(0,11) = 1.;
        dphi(1,11) = 1.;
        dphi(2,11) = -1.;
        
        dphi(0,12) = -1;
        dphi(1,12) = 1.;
        dphi(2,12) = -1.;
        
        return;
    }

    phi(0,0) = ((1 + eta + qsi)*(-1 + eta + zeta)*(-1 + qsi + zeta))/(4.*(-1 + zeta));
    phi(1,0) = -((1 + eta - qsi)*(1 + qsi - zeta)*(-1 + eta + zeta))/(4.*(-1 + zeta));
    phi(2,0) = -((-1 + eta + qsi)*(1 + eta - zeta)*(1 + qsi - zeta))/(4.*(-1 + zeta));
    phi(3,0) = ((-1 + eta - qsi)*(1 + eta - zeta)*(-1 + qsi + zeta))/(4.*(-1 + zeta));
    phi(4,0) = zeta*(-1 + 2*zeta);
    phi(5,0) = ((-1 + eta + zeta)*(-1 - qsi + zeta)*(-1 + qsi + zeta))/(2.*(-1 + zeta));
    phi(6,0) = ((-1 - eta + zeta)*(-1 + eta + zeta)*(-1 - qsi + zeta))/(2.*(-1 + zeta));
    phi(7,0) = ((qsi*qsi - (-1 + zeta)*(-1 + zeta))*(1 + eta - zeta))/(2.*(-1 + zeta));
    phi(8,0) = ((-(eta*eta) + (-1 + zeta)*(-1 + zeta))*(-1 + qsi + zeta))/(2.*(-1 + zeta));
    phi(9,0) = -((zeta*(-1 + eta + zeta)*(-1 + qsi + zeta))/(-1 + zeta));
    phi(10,0) = -((zeta*(-1 + eta + zeta)*(-1 - qsi + zeta))/(-1 + zeta));
    phi(11,0) = ((1 + eta - zeta)*(1 + qsi - zeta)*zeta)/(1 - zeta);
    phi(12,0) = -((zeta*(-1 - eta + zeta)*(-1 + qsi + zeta))/(-1 + zeta));


    dphi(0,0) = ((-1 + eta + zeta)*(eta + 2*qsi + zeta))/(4.*(-1 + zeta));
    dphi(1,0) = ((-1 + qsi + zeta)*(2*eta + qsi + zeta))/(4.*(-1 + zeta));
    dphi(2,0) = -(eta*eta*qsi + eta*(qsi + qsi*qsi - (-1 + zeta)*(-1 + zeta)) - (1 + qsi)*((-1 + zeta)*(-1 + zeta)))/(4.*((-1 + zeta)*(-1 + zeta)));

    dphi(0,1) = -((-1 + eta + zeta)*(eta - 2*qsi + zeta))/(4.*(-1 + zeta));
    dphi(1,1) = ((1 + qsi - zeta)*(-2*eta + qsi - zeta))/(4.*(-1 + zeta));
    dphi(2,1) = (eta*eta*qsi + eta*(qsi - qsi*qsi + (-1 + zeta)*(-1 + zeta)) - (-1 + qsi)*((-1 + zeta)*(-1 + zeta)))/(4.*((-1 + zeta)*(-1 + zeta)));

    dphi(0,2) = -((1 + eta - zeta)*(eta + 2*qsi - zeta))/(4.*(-1 + zeta));
    dphi(1,2) = -((1 + qsi - zeta)*(2*eta + qsi - zeta))/(4.*(-1 + zeta));
    dphi(2,2) = (eta*eta*qsi + eta*(-qsi + qsi*qsi - (-1 + zeta)*(-1 + zeta)) - (-1 + qsi)*((-1 + zeta)*(-1 + zeta)))/(4.*((-1 + zeta)*(-1 + zeta)));

    dphi(0,3) = ((1 + eta - zeta)*(eta - 2*qsi - zeta))/(4.*(-1 + zeta));
    dphi(1,3) = ((2*eta - qsi - zeta)*(-1 + qsi + zeta))/(4.*(-1 + zeta));
    dphi(2,3) = (-(eta*eta*qsi) + eta*(qsi + qsi*qsi - (-1 + zeta)*(-1 + zeta)) + (1 + qsi)*((-1 + zeta)*(-1 + zeta)))/(4.*((-1 + zeta)*(-1 + zeta)));

    dphi(0,4) = 0;
    dphi(1,4) = 0;
    dphi(2,4) = -1 + 4*zeta;

    dphi(0,5) = -((qsi*(-1 + eta + zeta))/(-1 + zeta));
    dphi(1,5) = (-(qsi*qsi) + (-1 + zeta)*(-1 + zeta))/(2.*(-1 + zeta));
    dphi(2,5) = (-2 + eta + (eta*(qsi*qsi))/((-1 + zeta)*(-1 + zeta)) + 2*zeta)/2.;

    dphi(0,6) = (eta*eta - (-1 + zeta)*(-1 + zeta))/(2.*(-1 + zeta));
    dphi(1,6) = (eta*(1 + qsi - zeta))/(-1 + zeta);
    dphi(2,6) = -1 + qsi*(-0.5 - (eta*eta)/(2.*((-1 + zeta)*(-1 + zeta)))) + zeta;

    dphi(0,7) = (qsi*(1 + eta - zeta))/(-1 + zeta);
    dphi(1,7) = (qsi*qsi - (-1 + zeta)*(-1 + zeta))/(2.*(-1 + zeta));
    dphi(2,7) = -1 + eta*(-0.5 - (qsi*qsi)/(2.*((-1 + zeta)*(-1 + zeta)))) + zeta;

    dphi(0,8) = (-(eta*eta) + (-1 + zeta)*(-1 + zeta))/(2.*(-1 + zeta));
    dphi(1,8) = -((eta*(-1 + qsi + zeta))/(-1 + zeta));
    dphi(2,8) = (-2 + qsi + (eta*eta*qsi)/((-1 + zeta)*(-1 + zeta)) + 2*zeta)/2.;

    dphi(0,9) = -((zeta*(-1 + eta + zeta))/(-1 + zeta));
    dphi(1,9) = -((zeta*(-1 + qsi + zeta))/(-1 + zeta));
    dphi(2,9) = 1 - qsi + eta*(-1 + qsi/((-1 + zeta)*(-1 + zeta))) - 2*zeta;

    dphi(0,10) = (zeta*(-1 + eta + zeta))/(-1 + zeta);
    dphi(1,10) = ((1 + qsi - zeta)*zeta)/(-1 + zeta);
    dphi(2,10) = 1 + qsi + eta*(-1 - qsi/((-1 + zeta)*(-1 + zeta))) - 2*zeta;

    dphi(0,11) = (zeta*(-1 - eta + zeta))/(-1 + zeta);
    dphi(1,11) = (zeta*(-1 - qsi + zeta))/(-1 + zeta);
    dphi(2,11) = 1 + eta + qsi + (eta*qsi)/((-1 + zeta)*(-1 + zeta)) - 2*zeta;

    dphi(0,12) = ((1 + eta - zeta)*zeta)/(-1 + zeta);
    dphi(1,12) = (zeta*(-1 + qsi + zeta))/(-1 + zeta);
    dphi(2,12) = 1 + eta - qsi - (eta*qsi)/((-1 + zeta)*(-1 + zeta)) - 2*zeta;
    
}